

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O3

int __thiscall
Potassco::TheoryData::accept(TheoryData *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint id;
  int iVar1;
  TheoryTerm *pTVar2;
  Data *pDVar3;
  TheoryElement *pTVar4;
  long lVar5;
  undefined4 in_register_00000034;
  int *piVar6;
  uint uVar7;
  
  piVar6 = (int *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (int)__addr_len;
  uVar7 = piVar6[1];
  if ((iVar1 == 0) ||
     (((pDVar3 = this->data_, uVar7 < (uint)((pDVar3->terms).top >> 3) &&
       (*(long *)((long)(pDVar3->terms).mem.beg_ + (ulong)uVar7 * 8) != -1)) &&
      ((pDVar3->frame).term <= uVar7)))) {
    pTVar2 = getTerm(this,uVar7);
    pDVar3 = (Data *)(**(code **)(*(long *)__addr + 0x10))(__addr,this,(ulong)uVar7,pTVar2);
  }
  uVar7 = piVar6[2];
  if ((ulong)uVar7 != 0) {
    lVar5 = 0;
    do {
      id = *(uint *)((long)piVar6 + lVar5 + 0xc);
      if ((iVar1 == 0) ||
         (((pDVar3 = this->data_, id < (uint)((pDVar3->elems).top >> 3) &&
           (*(long *)((long)(pDVar3->elems).mem.beg_ + (ulong)id * 8) != 0)) &&
          ((pDVar3->frame).elem <= id)))) {
        pTVar4 = getElement(this,id);
        pDVar3 = (Data *)(**(code **)(*(long *)__addr + 0x18))(__addr,this,(ulong)id,pTVar4);
      }
      lVar5 = lVar5 + 4;
    } while ((ulong)uVar7 << 2 != lVar5);
  }
  if (*piVar6 < 0) {
    uVar7 = piVar6[(ulong)(uint)piVar6[2] + 3];
    if ((iVar1 == 0) ||
       (((pDVar3 = this->data_, uVar7 < (uint)((pDVar3->terms).top >> 3) &&
         (*(long *)((long)(pDVar3->terms).mem.beg_ + (ulong)uVar7 * 8) != -1)) &&
        ((pDVar3->frame).term <= uVar7)))) {
      pTVar2 = getTerm(this,uVar7);
      pDVar3 = (Data *)(**(code **)(*(long *)__addr + 0x10))(__addr,this,(ulong)uVar7,pTVar2);
      if (-1 < *piVar6) goto LAB_0011cdd8;
      uVar7 = piVar6[(ulong)(piVar6[2] + 1) + 3];
      if (iVar1 == 0) goto LAB_0011ce7e;
    }
    else {
      uVar7 = piVar6[(ulong)(piVar6[2] + 1) + 3];
    }
    pDVar3 = this->data_;
    if (((uVar7 < (uint)((pDVar3->terms).top >> 3)) &&
        (*(long *)((long)(pDVar3->terms).mem.beg_ + (ulong)uVar7 * 8) != -1)) &&
       ((pDVar3->frame).term <= uVar7)) {
LAB_0011ce7e:
      pTVar2 = getTerm(this,uVar7);
      iVar1 = (**(code **)(*(long *)__addr + 0x10))
                        (__addr,this,uVar7,pTVar2,*(code **)(*(long *)__addr + 0x10));
      return iVar1;
    }
  }
LAB_0011cdd8:
  return (int)pDVar3;
}

Assistant:

void TheoryData::accept(const TheoryAtom& a, Visitor& out, VisitMode m) const {
	if (doVisitTerm(m, a.term())) { out.visit(*this, a.term(), getTerm(a.term())); }
	for (TheoryElement::iterator eIt = a.begin(), eEnd = a.end(); eIt != eEnd; ++eIt) {
		if (doVisitElem(m, *eIt)) { out.visit(*this, *eIt, getElement(*eIt)); }
	}
	if (a.guard() && doVisitTerm(m, *a.guard())) { out.visit(*this, *a.guard(), getTerm(*a.guard())); }
	if (a.rhs() && doVisitTerm(m, *a.rhs()))     { out.visit(*this, *a.rhs(),   getTerm(*a.rhs())); }
}